

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O3

int SafeDecodeCommandBlockSwitch(BrotliDecoderStateInternal *s)

{
  BrotliBitReader *br;
  byte bVar1;
  uint32_t uVar2;
  ulong uVar3;
  byte *pbVar4;
  size_t sVar5;
  byte *pbVar6;
  int iVar7;
  ulong uVar8;
  uint32_t uVar9;
  HuffmanCode *pHVar10;
  uint32_t uVar11;
  size_t sVar12;
  uint uVar13;
  uint64_t uVar14;
  uint local_4c;
  uint32_t local_48;
  uint local_44;
  byte *local_40;
  HuffmanCode *local_38;
  
  local_48 = s->num_block_types[1];
  pHVar10 = s->block_type_trees;
  local_38 = s->block_len_trees + 0x18c;
  br = &s->br;
  uVar3 = (s->br).val_;
  uVar2 = (s->br).bit_pos_;
  pbVar4 = (s->br).next_in;
  sVar5 = (s->br).avail_in;
  uVar13 = uVar2 - 0x32;
  uVar8 = uVar3;
  uVar9 = uVar2;
  pbVar6 = pbVar4;
  sVar12 = sVar5;
  while (uVar13 < 0xf) {
    sVar12 = sVar12 - 1;
    if (sVar12 == 0xffffffffffffffff) {
      iVar7 = SafeDecodeSymbol(pHVar10 + 0x278,br,&local_4c);
      if (iVar7 == 0) {
        return 0;
      }
      goto LAB_001054de;
    }
    (s->br).val_ = uVar8 >> 8;
    uVar8 = uVar8 >> 8 | (ulong)*pbVar6 << 0x38;
    (s->br).val_ = uVar8;
    (s->br).bit_pos_ = uVar9 - 8;
    (s->br).avail_in = sVar12;
    (s->br).next_in = pbVar6 + 1;
    uVar13 = uVar9 - 0x3a;
    uVar9 = uVar9 - 8;
    pbVar6 = pbVar6 + 1;
  }
  uVar8 = uVar8 >> ((byte)uVar9 & 0x3f);
  pHVar10 = pHVar10 + 0x278 + (uVar8 & 0xff);
  uVar13 = (uint)pHVar10->bits;
  if (8 < uVar13) {
    uVar9 = uVar9 + 8;
    pHVar10 = pHVar10 + (ulong)pHVar10->value +
                        (ulong)((uint)(uVar8 >> 8) & 0xffffff & kBitMask[pHVar10->bits - 8] & 0x7f);
    uVar13 = (uint)pHVar10->bits;
  }
  (s->br).bit_pos_ = uVar13 + uVar9;
  local_4c = (uint)pHVar10->value;
LAB_001054de:
  local_40 = pbVar4;
  if (s->substate_read_block_length == BROTLI_STATE_READ_BLOCK_LENGTH_NONE) {
    uVar9 = (s->br).bit_pos_;
    if (uVar9 - 0x32 < 0xf) {
      sVar12 = (s->br).avail_in;
      uVar11 = uVar9;
      do {
        sVar12 = sVar12 - 1;
        if (sVar12 == 0xffffffffffffffff) {
          iVar7 = SafeDecodeSymbol(local_38,br,&local_44);
          if (iVar7 != 0) goto LAB_001055dd;
          goto LAB_0010569f;
        }
        uVar8 = (s->br).val_;
        pbVar4 = (s->br).next_in;
        (s->br).val_ = uVar8 >> 8;
        uVar8 = (ulong)*pbVar4 << 0x38 | uVar8 >> 8;
        (s->br).val_ = uVar8;
        uVar9 = uVar11 - 8;
        (s->br).bit_pos_ = uVar9;
        (s->br).avail_in = sVar12;
        (s->br).next_in = pbVar4 + 1;
        uVar13 = uVar11 - 0x3a;
        uVar11 = uVar9;
      } while (uVar13 < 0xf);
    }
    else {
      uVar8 = br->val_;
    }
    uVar8 = uVar8 >> ((byte)uVar9 & 0x3f);
    local_38 = local_38 + (uVar8 & 0xff);
    uVar13 = (uint)local_38->bits;
    if (8 < uVar13) {
      uVar9 = uVar9 + 8;
      local_38 = local_38 +
                 (ulong)local_38->value +
                 (ulong)((uint)(uVar8 >> 8) & 0xffffff & kBitMask[local_38->bits - 8] & 0x7f);
      uVar13 = (uint)local_38->bits;
    }
    (s->br).bit_pos_ = uVar13 + uVar9;
    local_44 = (uint)local_38->value;
  }
  else {
    local_44 = s->block_length_index;
  }
LAB_001055dd:
  bVar1 = kBlockLengthPrefixCode[local_44].nbits;
  uVar9 = (s->br).bit_pos_;
  uVar13 = 0x40 - uVar9;
  if (uVar13 < bVar1) {
    sVar12 = (s->br).avail_in;
    do {
      sVar12 = sVar12 - 1;
      if (sVar12 == 0xffffffffffffffff) {
        s->block_length_index = local_44;
LAB_0010569f:
        s->substate_read_block_length = BROTLI_STATE_READ_BLOCK_LENGTH_NONE;
        (s->br).val_ = uVar3;
        (s->br).bit_pos_ = uVar2;
        (s->br).next_in = local_40;
        (s->br).avail_in = sVar5;
        return 0;
      }
      uVar8 = (s->br).val_;
      pbVar4 = (s->br).next_in;
      (s->br).val_ = uVar8 >> 8;
      uVar14 = (ulong)*pbVar4 << 0x38 | uVar8 >> 8;
      (s->br).val_ = uVar14;
      uVar9 = uVar9 - 8;
      (s->br).bit_pos_ = uVar9;
      (s->br).avail_in = sVar12;
      (s->br).next_in = pbVar4 + 1;
      uVar13 = uVar13 + 8;
    } while (uVar13 < bVar1);
  }
  else {
    uVar14 = br->val_;
  }
  uVar13 = kBitMask[(uint)bVar1];
  (s->br).bit_pos_ = uVar9 + bVar1;
  s->block_length[1] =
       (uint)kBlockLengthPrefixCode[local_44].offset +
       ((uint)(uVar14 >> ((byte)uVar9 & 0x3f)) & uVar13);
  s->substate_read_block_length = BROTLI_STATE_READ_BLOCK_LENGTH_NONE;
  if (local_4c == 0) {
    local_4c = s->block_type_rb[2];
  }
  else if (local_4c == 1) {
    local_4c = s->block_type_rb[3] + 1;
  }
  else {
    local_4c = local_4c - 2;
  }
  uVar13 = 0;
  if (local_48 <= local_4c) {
    uVar13 = local_48;
  }
  s->block_type_rb[2] = s->block_type_rb[3];
  s->block_type_rb[3] = local_4c - uVar13;
  s->htree_command = (s->insert_copy_hgroup).htrees[local_4c - uVar13];
  return 1;
}

Assistant:

static BROTLI_BOOL BROTLI_NOINLINE SafeDecodeCommandBlockSwitch(
    BrotliDecoderState* s) {
  return DecodeCommandBlockSwitchInternal(1, s);
}